

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> * __thiscall
fasttext::Dictionary::getMorph(Dictionary *this,int32_t i)

{
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/dictionary.cc"
                  ,0x6e,"const std::vector<subentry> &fasttext::Dictionary::getMorph(int32_t) const"
                 );
  }
  if (i < this->nwords_) {
    return &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start[(uint)i].submorph;
  }
  __assert_fail("i < nwords_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Aditi138[P]Embeddings/src/dictionary.cc"
                ,0x6f,"const std::vector<subentry> &fasttext::Dictionary::getMorph(int32_t) const");
}

Assistant:

const std::vector<subentry>& Dictionary::getMorph(int32_t i) const {
  assert(i >= 0);
  assert(i < nwords_);
  return words_[i].submorph;
}